

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O3

void model_rd_for_sb_with_curvfit
               (AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
               int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
               int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  char cVar1;
  BLOCK_SIZE bsize_00;
  int iVar2;
  long lVar3;
  _func_int64_t_uint8_t_ptr_int_uint8_t_ptr_int_int_int **pp_Var4;
  int64_t iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  int *piVar10;
  int block_height;
  long lVar11;
  long lVar12;
  long lVar13;
  int block_width;
  byte bVar14;
  long lVar15;
  buf_2d *pbVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double sse_norm;
  double dist_by_sse_norm_f;
  double rate_f;
  double local_40;
  double local_38;
  
  if (plane_to < plane_from) {
    lVar13 = 0;
    lVar11 = 0;
    lVar12 = 0;
  }
  else {
    cVar1 = (*xd->mi)->ref_frame[0];
    lVar3 = (long)plane_from;
    piVar10 = &xd->plane[lVar3].subsampling_x;
    pbVar16 = &x->plane[lVar3].src;
    lVar15 = 0;
    lVar12 = 0;
    lVar11 = 0;
    lVar13 = 0;
    do {
      if ((-lVar3 != lVar15) && (xd->is_chroma_ref != true)) break;
      bsize_00 = av1_ss_size_lookup[bsize][*piVar10][piVar10[1]];
      uVar6 = (uint)block_size_high[bsize_00];
      if ((xd->mb_to_bottom_edge < 0) &&
         (uVar6 = (xd->mb_to_bottom_edge >> ((char)piVar10[1] + 3U & 0x1f)) +
                  (uint)block_size_high[bsize_00], (int)uVar6 < 1)) {
        uVar6 = 0;
      }
      uVar7 = (uint)block_size_wide[bsize_00];
      if ((xd->mb_to_right_edge < 0) &&
         (uVar7 = (xd->mb_to_right_edge >> ((char)*piVar10 + 3U & 0x1f)) +
                  (uint)block_size_wide[bsize_00], (int)uVar7 < 1)) {
        uVar7 = 0;
      }
      pp_Var4 = &aom_highbd_sse;
      if ((xd->cur_buf->flags & 8) == 0) {
        pp_Var4 = &aom_sse;
      }
      iVar2 = xd->bd;
      iVar5 = (**pp_Var4)(pbVar16->buf,pbVar16->stride,((buf_2d *)(piVar10 + 3))->buf,piVar10[9],
                          uVar7,uVar6);
      bVar14 = (char)iVar2 * '\x02' - 0x10;
      lVar17 = (long)((ulong)((uint)(1 << (bVar14 & 0x1f)) >> 1) + iVar5) >> (bVar14 & 0x3f);
      bVar14 = 3;
      if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
        bVar14 = (char)(x->e_mbd).bd - 5;
      }
      if (lVar17 == 0) {
        iVar2 = 0;
        lVar8 = 0;
      }
      else {
        iVar2 = (int)(*(int16_t **)((long)(pbVar16 + 2) + 0x10))[1] >> (bVar14 & 0x1f);
        if (iVar2 < 2) {
          iVar2 = 1;
        }
        dVar18 = (double)(int)(uVar7 * uVar6);
        sse_norm = (double)lVar17 / dVar18;
        dVar19 = log2(sse_norm / ((double)iVar2 * (double)iVar2));
        av1_model_rd_curvfit(bsize_00,sse_norm,dVar19,&local_38,&local_40);
        dVar19 = 0.0;
        if (0.0 <= local_38 * dVar18) {
          dVar19 = local_38 * dVar18;
        }
        iVar2 = (int)(dVar19 + 0.5);
        if (iVar2 == 0) {
          iVar2 = 0;
          lVar8 = lVar17 << 4;
        }
        else {
          dVar18 = sse_norm * local_40 * dVar18;
          dVar19 = 0.0;
          if (0.0 <= dVar18) {
            dVar19 = dVar18;
          }
          lVar8 = (long)(dVar19 + 0.5);
          if (lVar17 * 0x800 <= lVar8 * 0x80 + ((long)x->rdmult * (long)iVar2 + 0x100 >> 9)) {
            iVar2 = 0;
            lVar8 = lVar17 << 4;
          }
        }
      }
      if (-lVar3 == lVar15) {
        lVar9 = 0xffffffff;
        if (lVar17 < 0xffffffff) {
          lVar9 = lVar17;
        }
        x->pred_sse[cVar1] = (uint)lVar9;
      }
      if (plane_rate != (int *)0x0) {
        plane_rate[lVar3 + lVar15] = iVar2;
      }
      if (plane_sse != (int64_t *)0x0) {
        plane_sse[lVar3 + lVar15] = lVar17;
      }
      if (plane_dist != (int64_t *)0x0) {
        plane_dist[lVar3 + lVar15] = lVar8;
      }
      lVar13 = lVar13 + lVar17;
      lVar12 = lVar12 + iVar2;
      lVar11 = lVar11 + lVar8;
      lVar15 = lVar15 + 1;
      piVar10 = piVar10 + 0x28c;
      pbVar16 = (buf_2d *)((long)(pbVar16 + 4) + 8);
    } while ((plane_to - plane_from) + 1 != (int)lVar15);
    lVar13 = lVar13 << 4;
  }
  if (skip_txfm_sb != (uint8_t *)0x0) {
    *skip_txfm_sb = lVar12 == 0;
  }
  if (skip_sse_sb != (int64_t *)0x0) {
    *skip_sse_sb = lVar13;
  }
  *out_rate_sum = (int)lVar12;
  *out_dist_sum = lVar11;
  return;
}

Assistant:

static inline void model_rd_for_sb_with_curvfit(
    const AV1_COMP *const cpi, BLOCK_SIZE bsize, MACROBLOCK *x, MACROBLOCKD *xd,
    int plane_from, int plane_to, int *out_rate_sum, int64_t *out_dist_sum,
    uint8_t *skip_txfm_sb, int64_t *skip_sse_sb, int *plane_rate,
    int64_t *plane_sse, int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    int64_t dist, sse;
    int rate;
    int bw, bh;
    const struct macroblock_plane *const p = &x->plane[plane];
    get_txb_dimensions(xd, plane, plane_bsize, 0, 0, plane_bsize, NULL, NULL,
                       &bw, &bh);

    sse = calculate_sse(xd, p, pd, bw, bh);
    model_rd_with_curvfit(cpi, x, plane_bsize, plane, sse, bw * bh, &rate,
                          &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;

    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
  }

  if (skip_txfm_sb) *skip_txfm_sb = rate_sum == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}